

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void __thiscall booster::log::sinks::file::shift(file *this,string *base)

{
  char *__old;
  uint n;
  _Alloc_hider __old_00;
  _Alloc_hider this_00;
  uint n_00;
  string local_70;
  string local_50;
  
  this_00._M_p = (pointer)base;
  format_file(&local_70,(file *)base,base,this->max_files_);
  remove(local_70._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_70);
  n = this->max_files_;
  while (n_00 = n - 1, n_00 != 0) {
    format_file(&local_70,(file *)this_00._M_p,base,n_00);
    __old_00._M_p = local_70._M_dataplus._M_p;
    format_file(&local_50,(file *)this_00._M_p,base,n);
    this_00._M_p = local_50._M_dataplus._M_p;
    rename(__old_00._M_p,local_50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    n = n_00;
  }
  __old = (base->_M_dataplus)._M_p;
  format_file(&local_70,(file *)this_00._M_p,base,1);
  rename(__old,local_70._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void file::shift(std::string const &base)
		{
			booster::nowide::remove(format_file(base,max_files_).c_str());
			for(unsigned file = max_files_-1;file > 0 ; file --) {
				booster::nowide::rename(format_file(base,file).c_str(),format_file(base,file+1).c_str());
			}
			
			booster::nowide::rename(base.c_str(),format_file(base,1).c_str());
		}